

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

expr_node * __thiscall expr_tree::mulDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *peVar3;
  expr_value local_30;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,1);
  expr_node::expr_node(this_00,'\x05',&local_30);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,3);
  peVar2 = derivative(this,node->left);
  peVar3 = Copy(node->right);
  expr_node::expr_node(peVar1,'\x05',&local_30,(expr_node *)0x0,peVar2,peVar3);
  this_00->left = peVar1;
  Link(peVar1,peVar1->left,peVar1->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,3);
  peVar2 = Copy(node->left);
  peVar3 = derivative(this,node->right);
  expr_node::expr_node(peVar1,'\x05',&local_30,(expr_node *)0x0,peVar2,peVar3);
  this_00->right = peVar1;
  Link(peVar1,peVar1->left,peVar1->right);
  Link(this_00,this_00->left,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::mulDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)ADD);
    deriv->left = new expr_node(OP, (long)MUL, nullptr, derivative(node->left), Copy(node->right));
    Link(deriv->left, deriv->left->left, deriv->left->right);
    deriv->right = new expr_node(OP, (long)MUL, nullptr, Copy(node->left), derivative(node->right));
    Link(deriv->right, deriv->right->left, deriv->right->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}